

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QString * __thiscall QAccessibleTabButton::text(QAccessibleTabButton *this,Text t)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  QString *other;
  uint in_EDX;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *str;
  QString *text;
  int index;
  uint in_stack_ffffffffffffff38;
  QString *in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  text = in_RDI;
  uVar3 = (**(code **)(*in_RSI + 0x10))();
  index = (int)((ulong)in_RSI >> 0x20);
  if ((uVar3 & 1) == 0) {
    QString::QString((QString *)0x7d6ca5);
  }
  else {
    in_stack_ffffffffffffff38 = in_stack_ffffffffffffff38 & 0xffffff;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x7d6cd1);
    other = (QString *)(ulong)in_EDX;
    switch(other) {
    case (QString *)0x0:
      QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d6d06);
      QTabBar::accessibleTabName((QTabBar *)CONCAT44(in_EDX,in_stack_ffffffffffffff38),index);
      QString::operator=(in_RDI,other);
      QString::~QString((QString *)0x7d6d3d);
      bVar2 = QString::isEmpty((QString *)0x7d6d47);
      if (bVar2) {
        QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d6d5b);
        QTabBar::tabText((QTabBar *)CONCAT44(in_EDX,in_stack_ffffffffffffff38),index);
        qt_accStripAmp(in_stack_ffffffffffffff58);
        QString::operator=(in_RDI,other);
        QString::~QString((QString *)0x7d6da7);
        QString::~QString((QString *)0x7d6db4);
      }
      break;
    case (QString *)0x1:
      QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d6e27);
      QTabBar::tabToolTip((QTabBar *)CONCAT44(in_EDX,in_stack_ffffffffffffff38),index);
      QString::operator=(in_RDI,other);
      QString::~QString((QString *)0x7d6e55);
      break;
    default:
      break;
    case (QString *)0x3:
      QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d6e65);
      QTabBar::tabWhatsThis((QTabBar *)CONCAT44(in_EDX,in_stack_ffffffffffffff38),index);
      QString::operator=(in_RDI,other);
      QString::~QString((QString *)0x7d6e93);
      break;
    case (QString *)0x4:
      QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d6dc7);
      QTabBar::tabText((QTabBar *)CONCAT44(in_EDX,in_stack_ffffffffffffff38),index);
      qt_accHotKey(text);
      QString::operator=(in_RDI,other);
      QString::~QString((QString *)0x7d6e0d);
      QString::~QString((QString *)0x7d6e17);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return text;
}

Assistant:

QString text(QAccessible::Text t) const override
    {
        if (!isValid())
            return QString();
        QString str;
        switch (t) {
        case QAccessible::Name:
            str = m_parent->accessibleTabName(m_index);
            if (str.isEmpty())
                str = qt_accStripAmp(m_parent->tabText(m_index));
            break;
        case QAccessible::Accelerator:
            str = qt_accHotKey(m_parent->tabText(m_index));
            break;
#if QT_CONFIG(tooltip)
        case QAccessible::Description:
            str = m_parent->tabToolTip(m_index);
            break;
#endif
#if QT_CONFIG(whatsthis)
        case QAccessible::Help:
            str = m_parent->tabWhatsThis(m_index);
            break;
#endif
        default:
            break;
        }
        return str;
    }